

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-graphics.cpp
# Opt level: O0

undefined8 Game::Graphics::EndOfEndlessPrompt_abi_cxx11_(void)

{
  ostream *poVar1;
  undefined8 in_RDI;
  ostringstream local_198 [8];
  ostringstream endless_mode_richtext;
  char *sp;
  char *endless_mode_text;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = Color::operator<<((ostream *)local_198,&red);
  poVar1 = Color::operator<<(poVar1,&bold_on);
  poVar1 = std::operator<<(poVar1,"  ");
  poVar1 = std::operator<<(poVar1,"End of endless mode! Thank you for playing!");
  poVar1 = Color::operator<<(poVar1,&def);
  poVar1 = Color::operator<<(poVar1,&bold_off);
  std::operator<<(poVar1,"\n\n\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return in_RDI;
}

Assistant:

std::string EndOfEndlessPrompt() {
  constexpr auto endless_mode_text =
      "End of endless mode! Thank you for playing!";
  constexpr auto sp = "  ";
  std::ostringstream endless_mode_richtext;
  endless_mode_richtext << red << bold_on << sp << endless_mode_text << def
                        << bold_off << "\n\n\n";
  return endless_mode_richtext.str();
}